

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O2

void __thiscall
CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  AssertHelper aAStack_c8 [2];
  char *local_b8;
  undefined8 local_b0;
  char local_a8 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98 [4];
  TypeParam mtx;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&mtx);
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_b0 = 0;
  local_b8 = local_a8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::lock(&mtx.super_mutex_base);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_b0 = 0;
  local_b8 = local_a8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::lock(&mtx.super_mutex_base);
  }
  std::__cxx11::string::assign((char *)&local_b8);
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x51,local_b8);
  testing::internal::AssertHelper::operator=(aAStack_c8,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(aAStack_c8);
  if (local_98[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_b8);
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_b0 = 0;
  local_b8 = local_a8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::unlock(&mtx.super_mutex_base);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&mtx);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, RecurseLock) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.lock());
  ASSERT_NO_THROW(mtx.unlock());
}